

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O2

void __thiscall
MultiQuery<dto::Complex,_dto::Simple>::MultiQuery
          (MultiQuery<dto::Complex,_dto::Simple> *this,Complex *req,uint16_t port,string *addr,
          int timeout)

{
  int iVar1;
  int iVar2;
  int optval;
  undefined2 local_58;
  ushort uStack_56;
  in_addr iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  string local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"MultiQuery",(allocator<char> *)&local_58);
  Subscriber::Subscriber(&this->super_Subscriber,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_001587c0;
  dto::Complex::Complex(&this->req,req);
  (this->done).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->done)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->done).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->done).super__Function_base._M_functor + 8) = 0;
  (this->error).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->error)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->error).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->error).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  std::__cxx11::string::string((string *)&this->addr,(string *)addr);
  this->timeout = timeout;
  uStack_4c = 0;
  iStack_54.s_addr = 0;
  uStack_50 = 0;
  iVar1 = socket(2,2,0);
  iVar1 = no_err(iVar1,"Could not open udp socket");
  optval = 1;
  iVar2 = setsockopt(iVar1,1,6,&optval,4);
  no_err(iVar2,"setsockopt SO_BROADCAST");
  optval = 4;
  iVar2 = setsockopt(iVar1,0,0x21,&optval,4);
  no_err(iVar2,"setscokopt TTL");
  local_58 = 2;
  uStack_56 = port << 8 | port >> 8;
  iVar2 = inet_aton((addr->_M_dataplus)._M_p,&iStack_54);
  no_err(iVar2,"inet_aton");
  (this->remote).sin_family = local_58;
  (this->remote).sin_port = uStack_56;
  (this->remote).sin_addr = (in_addr)iStack_54.s_addr;
  *(ulong *)(this->remote).sin_zero = CONCAT44(uStack_4c,uStack_50);
  Subscriber::set_fd(&this->super_Subscriber,iVar1);
  Subscriber::set_expected(&this->super_Subscriber,4);
  return;
}

Assistant:

MultiQuery<REQ, RES>::MultiQuery(REQ &req, uint16_t port, std::string addr, int timeout) :
    Subscriber("MultiQuery"),
    req(std::move(req)),
    addr(addr), timeout(timeout) {

  struct sockaddr_in remote_address{};

  int sock = no_err(socket(AF_INET, SOCK_DGRAM, 0), "Could not open udp socket");

  int optval = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_BROADCAST, (void *) &optval, sizeof optval), "setsockopt SO_BROADCAST");
  optval = 4;
  no_err(setsockopt(sock, IPPROTO_IP, IP_MULTICAST_TTL, (void *) &optval, sizeof optval), "setscokopt TTL");

  remote_address.sin_family = AF_INET;
  remote_address.sin_port = htons(port);
  no_err(inet_aton(&addr[0], &remote_address.sin_addr), "inet_aton");
  remote = remote_address;
  set_fd(sock);
  set_expected(POLLOUT);
}